

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXProperties.h
# Opt level: O2

void __thiscall
Assimp::FBX::
TypedProperty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
~TypedProperty(TypedProperty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *this)

{
  ~TypedProperty(this);
  operator_delete(this);
  return;
}

Assistant:

explicit TypedProperty(const T& value)
    : value(value) {
        // empty
    }